

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_def_io.c
# Opt level: O0

int32 parse_tri_line(char *line,int lineno,acmod_id_t *acmod_id,uint32 *tmat,uint32 *state,
                    uint32 *n_state,acmod_set_t *acmod_set)

{
  word_posn_t posn_00;
  acmod_id_t aVar1;
  acmod_id_t left_context;
  acmod_id_t right_context;
  int32 iVar2;
  ulong uVar3;
  size_t sVar4;
  word_posn_t posn;
  acmod_id_t right;
  acmod_id_t left;
  acmod_id_t base;
  char **attrib;
  char *posn_map;
  uint32 id;
  uint i;
  char *tok;
  uint32 *n_state_local;
  uint32 *state_local;
  uint32 *tmat_local;
  acmod_id_t *acmod_id_local;
  char *pcStack_18;
  int lineno_local;
  char *line_local;
  
  attrib = (char **)anon_var_dwarf_41e2;
  tok = (char *)n_state;
  n_state_local = state;
  state_local = tmat;
  tmat_local = acmod_id;
  acmod_id_local._4_4_ = lineno;
  pcStack_18 = line;
  _id = strtok(line," \t");
  aVar1 = acmod_set_name2id(acmod_set,_id);
  posn_map._0_4_ = aVar1;
  if (aVar1 == 0xffffffff) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
            ,0xd0,"%s is an undefined base phone at line %d\n",_id,(ulong)acmod_id_local._4_4_);
    line_local._4_4_ = -1;
  }
  else {
    _id = strtok((char *)0x0," \t");
    left_context = acmod_set_name2id(acmod_set,_id);
    posn_map._0_4_ = left_context;
    if (left_context == 0xffffffff) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
              ,0xda,"%s is an undefined base phone at line %d\n",_id,(ulong)acmod_id_local._4_4_);
      line_local._4_4_ = -1;
    }
    else {
      _id = strtok((char *)0x0," \t");
      right_context = acmod_set_name2id(acmod_set,_id);
      posn_map._0_4_ = right_context;
      if (right_context == 0xffffffff) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                ,0xe4,"%s is an undefined base phone at line %d\n",_id,(ulong)acmod_id_local._4_4_);
        line_local._4_4_ = -1;
      }
      else {
        _id = strtok((char *)0x0," \t");
        posn_map._4_4_ = WORD_POSN_BEGIN;
        while ((uVar3 = (ulong)posn_map._4_4_, sVar4 = strlen((char *)attrib), uVar3 < sVar4 &&
               (*_id != *(char *)((long)attrib + (ulong)posn_map._4_4_)))) {
          posn_map._4_4_ = posn_map._4_4_ + WORD_POSN_END;
        }
        uVar3 = (ulong)posn_map._4_4_;
        sVar4 = strlen((char *)attrib);
        posn_00 = posn_map._4_4_;
        if (uVar3 < sVar4) {
          iVar2 = parse_rem((char ***)&left,state_local,n_state_local,(uint32 *)tok,
                            acmod_id_local._4_4_);
          if (iVar2 == 0) {
            aVar1 = acmod_set_add_tri(acmod_set,aVar1,left_context,right_context,posn_00,_left);
            *tmat_local = aVar1;
            if (*tmat_local == 0xffffffff) {
              line_local._4_4_ = -1;
            }
            else {
              line_local._4_4_ = 0;
            }
          }
          else {
            line_local._4_4_ = -1;
          }
        }
        else {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                  ,0xf5,"Unknown word posn %s found at line %d\n",_id,(ulong)acmod_id_local._4_4_);
          line_local._4_4_ = -1;
        }
      }
    }
  }
  return line_local._4_4_;
}

Assistant:

static int32
parse_tri_line(char *line,
	       int lineno,
	       acmod_id_t *acmod_id,
	       uint32 *tmat,
	       uint32 *state,
	       uint32 *n_state,
	       acmod_set_t *acmod_set)
{
    char *tok;
    unsigned int i;
    uint32 id;
    char *posn_map = WORD_POSN_CHAR_MAP;
    const char **attrib;
    acmod_id_t base, left, right;
    word_posn_t posn;

    tok = strtok(line, " \t");

    if ((id = acmod_set_name2id(acmod_set, tok)) == NO_ACMOD) {
	E_ERROR("%s is an undefined base phone at line %d\n",
		tok, lineno);
	return S3_ERROR;
    }

    base = id;

    tok = strtok(NULL, " \t");

    if ((id = acmod_set_name2id(acmod_set, tok)) == NO_ACMOD) {
	E_ERROR("%s is an undefined base phone at line %d\n",
		tok, lineno);
	return S3_ERROR;
    }

    left = id;

    tok = strtok(NULL, " \t");

    if ((id = acmod_set_name2id(acmod_set, tok)) == NO_ACMOD) {
	E_ERROR("%s is an undefined base phone at line %d\n",
		tok, lineno);
	return S3_ERROR;
    }

    right = id;

    tok = strtok(NULL, " \t");

    for (i = 0; i < strlen(posn_map); i++)
	if (tok[0] == posn_map[i])
	    break;
    
    if (i < strlen(posn_map)) {
	posn = (word_posn_t)i;
    }
    else {
	E_ERROR("Unknown word posn %s found at line %d\n",
		tok, lineno);
	return S3_ERROR;
    }

    if (parse_rem(&attrib, tmat, state, n_state, lineno) != S3_SUCCESS) {
	return S3_ERROR;
    }
    
    *acmod_id = acmod_set_add_tri(acmod_set, base, left, right, posn, attrib);
    if (*acmod_id == NO_ACMOD) {
	return S3_ERROR;
    }

    return S3_SUCCESS;
}